

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::geSI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  Literal *pLVar1;
  bool bVar2;
  Literal *val;
  long lVar3;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  undefined1 local_200 [8];
  LaneArray<8> other_lanes;
  LaneArray<8> lanes;
  anon_union_16_6_1532cd5a_for_Literal_0 local_68;
  undefined8 local_58;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  local_38 = __return_storage_ptr__;
  getLanes<short,8>((LaneArray<8> *)&other_lanes._M_elems[7].type,(wasm *)this,other);
  getLanes<short,8>((LaneArray<8> *)local_200,(wasm *)other,val);
  __return_storage_ptr___00 = &lanes._M_elems[7].type;
  for (lVar3 = 0; pLVar1 = local_38, lVar3 != 0xc0; lVar3 = lVar3 + 0x18) {
    this_00 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)lanes._M_elems + lVar3 + -8);
    geS((Literal *)__return_storage_ptr___00,(Literal *)&this_00->func,
        (Literal *)(local_200 + lVar3));
    local_50.i32 = 1;
    local_40 = 2;
    bVar2 = operator==((Literal *)__return_storage_ptr___00,(Literal *)&local_50.func);
    local_68.i32 = -(uint)bVar2;
    local_58 = 2;
    if (this_00 != &local_68) {
      ~Literal((Literal *)&this_00->func);
      Literal((Literal *)&this_00->func,(Literal *)&local_68.func);
    }
    ~Literal((Literal *)&local_68.func);
    ~Literal((Literal *)&local_50.func);
    ~Literal((Literal *)__return_storage_ptr___00);
  }
  Literal(local_38,(LaneArray<8> *)&other_lanes._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_200);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&other_lanes._M_elems[7].type)
  ;
  return pLVar1;
}

Assistant:

Literal Literal::geSI16x8(const Literal& other) const {
  return compare<8, &Literal::getLanesSI16x8, &Literal::geS>(*this, other);
}